

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

void __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness2Test::deinit
          (MultisampleTextureDependenciesFBOIncompleteness2Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->fbo_id);
    this->fbo_id = 0;
  }
  if (this->to_id_2d != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d);
    this->to_id_2d = 0;
  }
  if (this->to_id_multisample_2d != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_multisample_2d);
    this->to_id_multisample_2d = 0;
  }
  if (this->to_id_multisample_2d_array != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_multisample_2d_array);
    this->to_id_multisample_2d_array = 0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureDependenciesFBOIncompleteness2Test::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &fbo_id);

		fbo_id = 0;
	}

	if (to_id_2d != 0)
	{
		gl.deleteTextures(1, &to_id_2d);

		to_id_2d = 0;
	}

	if (to_id_multisample_2d != 0)
	{
		gl.deleteTextures(1, &to_id_multisample_2d);

		to_id_multisample_2d = 0;
	}

	if (to_id_multisample_2d_array != 0)
	{
		gl.deleteTextures(1, &to_id_multisample_2d_array);

		to_id_multisample_2d_array = 0;
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}